

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O0

int count_from(int v,int skip,bool clean)

{
  int iVar1;
  iterator iVar2;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_59;
  _Bit_type *local_58;
  uint local_50;
  _Bit_type *local_48;
  uint local_40;
  _Bit_type *local_38;
  uint local_30;
  _Bit_type *local_28;
  uint local_20;
  byte local_11;
  int local_10;
  int iStack_c;
  bool clean_local;
  int skip_local;
  int v_local;
  
  local_11 = clean;
  local_10 = skip;
  iStack_c = v;
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedcnt,(long)V,false);
  if ((local_11 & 1) != 0) {
    iVar2 = std::vector<bool,_std::allocator<bool>_>::begin
                      ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedcnt);
    local_38 = iVar2.super__Bit_iterator_base._M_p;
    local_30 = iVar2.super__Bit_iterator_base._M_offset;
    local_28 = local_38;
    local_20 = local_30;
    iVar2 = std::vector<bool,_std::allocator<bool>_>::end
                      ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedcnt);
    local_58 = iVar2.super__Bit_iterator_base._M_p;
    local_50 = iVar2.super__Bit_iterator_base._M_offset;
    local_59 = false;
    __first.super__Bit_iterator_base._M_offset = local_20;
    __first.super__Bit_iterator_base._M_p = local_28;
    __first.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(iVar2.super__Bit_iterator_base._0_12_,0);
    __last.super__Bit_iterator_base._M_offset = SUB124(iVar2.super__Bit_iterator_base._0_12_,8);
    local_48 = local_58;
    local_40 = local_50;
    std::fill<std::_Bit_iterator,bool>(__first,__last,&local_59);
  }
  iVar1 = count_rec(iStack_c,local_10);
  return iVar1;
}

Assistant:

int count_from(int v, int skip, bool clean = true){
    usedcnt.resize(V, false);

    if (clean) {
        fill(usedcnt.begin(), usedcnt.end(), false);
    }

    return count_rec(v, skip);
}